

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O3

int __thiscall
deqp::BlockMultiBasicTypesCase::init(BlockMultiBasicTypesCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_> *pvVar1;
  ShaderInterface *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  UniformBlock *pUVar4;
  UniformBlock *pUVar5;
  VarType VStack_88;
  Uniform local_70;
  
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar4 = ub::ShaderInterface::allocBlock(this_00,"BlockA");
  ub::VarType::VarType(&VStack_88,TYPE_FLOAT,4);
  ub::Uniform::Uniform(&local_70,"a",&VStack_88,0);
  pvVar1 = &pUVar4->m_uniforms;
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  paVar2 = &local_70.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  ub::VarType::VarType(&VStack_88,TYPE_UINT_VEC3,1);
  ub::Uniform::Uniform(&local_70,"b",&VStack_88,0xc00);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  ub::VarType::VarType(&VStack_88,TYPE_FLOAT_MAT2,2);
  ub::Uniform::Uniform(&local_70,"c",&VStack_88,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  std::__cxx11::string::_M_replace
            ((ulong)&pUVar4->m_instanceName,0,(char *)(pUVar4->m_instanceName)._M_string_length,
             0x1b841b8);
  pUVar4->m_flags = this->m_flagsA;
  pUVar5 = ub::ShaderInterface::allocBlock(this_00,"BlockB");
  ub::VarType::VarType(&VStack_88,TYPE_FLOAT_MAT3,2);
  ub::Uniform::Uniform(&local_70,"a",&VStack_88,0);
  pvVar1 = &pUVar5->m_uniforms;
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  ub::VarType::VarType(&VStack_88,TYPE_INT_VEC2,1);
  ub::Uniform::Uniform(&local_70,"b",&VStack_88,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  ub::VarType::VarType(&VStack_88,TYPE_FLOAT_VEC4,4);
  ub::Uniform::Uniform(&local_70,"c",&VStack_88,0xc00);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  ub::VarType::VarType(&VStack_88,TYPE_BOOL,0);
  ub::Uniform::Uniform(&local_70,"d",&VStack_88,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(pvVar1,&local_70);
  ub::VarType::~VarType(&local_70.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&VStack_88);
  std::__cxx11::string::_M_replace
            ((ulong)&pUVar5->m_instanceName,0,(char *)(pUVar5->m_instanceName)._M_string_length,
             0x1b841c6);
  pUVar5->m_flags = this->m_flagsB;
  iVar3 = this->m_numInstances;
  if (0 < iVar3) {
    pUVar4->m_arraySize = iVar3;
    pUVar5->m_arraySize = iVar3;
  }
  return iVar3;
}

Assistant:

void init(void)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}